

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::serializeTo
          (UnbasedUnsizedIntegerLiteral *this,ASTSerializer *serializer)

{
  ConstantValue *local_48;
  uint local_40;
  undefined1 local_3c;
  byte local_3b;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_38;
  logic_t local_18;
  
  getValue((UnbasedUnsizedIntegerLiteral *)&local_48);
  local_38._0_8_ = local_48;
  local_38._8_4_ = local_40;
  local_38._12_1_ = local_3c;
  local_38._13_1_ = local_3b;
  if (0x40 < local_40 || (local_3b & 1) != 0) {
    local_48 = (ConstantValue *)0x0;
  }
  local_18.value = '\x01';
  ASTSerializer::write(serializer,5,"value",(size_t)&local_38);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_38);
  if (((0x40 < local_40) || ((local_3b & 1) != 0)) && (local_48 != (ConstantValue *)0x0)) {
    operator_delete__(local_48);
  }
  return;
}

Assistant:

void UnbasedUnsizedIntegerLiteral::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
}